

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

bool icu_63::number::impl::GeneratorHelpers::unit
               (MacroProps *macros,UnicodeString *sb,UErrorCode *status)

{
  UErrorCode *pUVar1;
  bool bVar2;
  UBool UVar3;
  ConstChar16Ptr local_80;
  ConstChar16Ptr local_78;
  ConstChar16Ptr local_70;
  undefined4 local_64;
  undefined1 local_60 [8];
  CurrencyUnit currency;
  ConstChar16Ptr local_30;
  UErrorCode *local_28;
  UErrorCode *status_local;
  UnicodeString *sb_local;
  MacroProps *macros_local;
  
  local_28 = status;
  status_local = (UErrorCode *)sb;
  sb_local = (UnicodeString *)macros;
  bVar2 = utils::unitIsCurrency(&macros->unit);
  pUVar1 = status_local;
  if (bVar2) {
    ConstChar16Ptr::ConstChar16Ptr(&local_30,L"currency/");
    UnicodeString::append((UnicodeString *)pUVar1,&local_30,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_30);
    CurrencyUnit::CurrencyUnit
              ((CurrencyUnit *)local_60,(MeasureUnit *)((long)&sb_local->fUnion + 8),local_28);
    UVar3 = ::U_FAILURE(*local_28);
    macros_local._7_1_ = UVar3 == '\0';
    if ((bool)macros_local._7_1_) {
      blueprint_helpers::generateCurrencyOption
                ((CurrencyUnit *)local_60,(UnicodeString *)status_local,local_28);
    }
    local_64 = 1;
    CurrencyUnit::~CurrencyUnit((CurrencyUnit *)local_60);
  }
  else {
    bVar2 = utils::unitIsNoUnit((MeasureUnit *)((long)&sb_local->fUnion + 8));
    pUVar1 = status_local;
    if (bVar2) {
      bVar2 = utils::unitIsPercent((MeasureUnit *)((long)&sb_local->fUnion + 8));
      pUVar1 = status_local;
      if (bVar2) {
        ConstChar16Ptr::ConstChar16Ptr(&local_70,L"percent");
        UnicodeString::append((UnicodeString *)pUVar1,&local_70,-1);
        ConstChar16Ptr::~ConstChar16Ptr(&local_70);
        macros_local._7_1_ = 1;
      }
      else {
        bVar2 = utils::unitIsPermille((MeasureUnit *)((long)&sb_local->fUnion + 8));
        pUVar1 = status_local;
        if (bVar2) {
          ConstChar16Ptr::ConstChar16Ptr(&local_78,L"permille");
          UnicodeString::append((UnicodeString *)pUVar1,&local_78,-1);
          ConstChar16Ptr::~ConstChar16Ptr(&local_78);
          macros_local._7_1_ = 1;
        }
        else {
          macros_local._7_1_ = 0;
        }
      }
    }
    else {
      ConstChar16Ptr::ConstChar16Ptr(&local_80,L"measure-unit/");
      UnicodeString::append((UnicodeString *)pUVar1,&local_80,-1);
      ConstChar16Ptr::~ConstChar16Ptr(&local_80);
      blueprint_helpers::generateMeasureUnitOption
                ((MeasureUnit *)((long)&sb_local->fUnion + 8),(UnicodeString *)status_local,local_28
                );
      macros_local._7_1_ = 1;
    }
  }
  return (bool)(macros_local._7_1_ & 1);
}

Assistant:

bool GeneratorHelpers::unit(const MacroProps& macros, UnicodeString& sb, UErrorCode& status) {
    if (utils::unitIsCurrency(macros.unit)) {
        sb.append(u"currency/", -1);
        CurrencyUnit currency(macros.unit, status);
        if (U_FAILURE(status)) {
            return false;
        }
        blueprint_helpers::generateCurrencyOption(currency, sb, status);
        return true;
    } else if (utils::unitIsNoUnit(macros.unit)) {
        if (utils::unitIsPercent(macros.unit)) {
            sb.append(u"percent", -1);
            return true;
        } else if (utils::unitIsPermille(macros.unit)) {
            sb.append(u"permille", -1);
            return true;
        } else {
            // Default value is not shown in normalized form
            return false;
        }
    } else {
        sb.append(u"measure-unit/", -1);
        blueprint_helpers::generateMeasureUnitOption(macros.unit, sb, status);
        return true;
    }
}